

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O2

void __thiscall slang::parsing::Parser::handleExponentSplit(Parser *this,Token token,size_t offset)

{
  Lexer *this_00;
  Preprocessor *pPVar1;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  BumpAllocator *alloc;
  pointer ctx;
  Token sourceToken;
  SmallVectorBase<slang::parsing::Token> *in_stack_ffffffffffffff78;
  SmallVector<slang::parsing::Token,_4UL> split;
  
  split.super_SmallVectorBase<slang::parsing::Token>.data_ =
       (pointer)split.super_SmallVectorBase<slang::parsing::Token>.firstElement;
  split.super_SmallVectorBase<slang::parsing::Token>.len = 0;
  split.super_SmallVectorBase<slang::parsing::Token>.cap = 4;
  this_00 = (Lexer *)(this->super_ParserBase).alloc;
  alloc = (BumpAllocator *)ParserBase::getDiagnostics(&this->super_ParserBase);
  pPVar1 = (this->super_ParserBase).window.tokenSource;
  sourceToken.info = (Info *)offset;
  sourceToken._0_8_ = token.info;
  Lexer::splitTokens(this_00,alloc,(Diagnostics *)pPVar1->sourceManager,token._0_8_,sourceToken,
                     (ulong)(pPVar1->keywordVersionStack).
                            super__Vector_base<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1],(KeywordVersion)&split,
                     in_stack_ffffffffffffff78);
  tokens._M_extent._M_extent_value = split.super_SmallVectorBase<slang::parsing::Token>.len;
  tokens._M_ptr = split.super_SmallVectorBase<slang::parsing::Token>.data_;
  ctx = split.super_SmallVectorBase<slang::parsing::Token>.data_;
  ParserBase::pushTokens(&this->super_ParserBase,tokens);
  SmallVectorBase<slang::parsing::Token>::cleanup
            (&split.super_SmallVectorBase<slang::parsing::Token>,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

void Parser::handleExponentSplit(Token token, size_t offset) {
    SmallVector<Token, 4> split;
    Lexer::splitTokens(alloc, getDiagnostics(), getPP().getSourceManager(), token, offset,
                       getPP().getCurrentKeywordVersion(), split);

    pushTokens(split);
}